

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

int INT_EVclient_wait_for_shutdown(EVclient client)

{
  CManager cm;
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  timespec ts;
  timespec local_28;
  
  if (client->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    if (iVar2 == 0) goto LAB_001446b9;
  }
  else if (CMtrace_val[0xd] == 0) goto LAB_001446b9;
  if (CMtrace_PID != 0) {
    pFVar1 = (FILE *)client->cm->CMTrace_file;
    _Var3 = getpid();
    pVar4 = pthread_self();
    fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_28);
    fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
  }
  fprintf((FILE *)client->cm->CMTrace_file,"Client %d wait for shutdown \n",
          (ulong)(uint)client->my_node_id);
LAB_001446b9:
  fflush((FILE *)client->cm->CMTrace_file);
  if (client->already_shutdown == 0) {
    cm = client->cm;
    iVar2 = new_shutdown_condition(client,client->master_connection);
    INT_CMCondition_wait(cm,iVar2);
    iVar2 = CMtrace_val[0xd];
    if (client->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(client->cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)client->cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
      }
      fprintf((FILE *)client->cm->CMTrace_file,"Client %d wait for shutdown DONE! \n",
              (ulong)(uint)client->my_node_id);
    }
    fflush((FILE *)client->cm->CMTrace_file);
  }
  return client->shutdown_value;
}

Assistant:

extern int 
INT_EVclient_wait_for_shutdown(EVclient client)
{
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d wait for shutdown \n", client->my_node_id);
    if (client->already_shutdown) return client->shutdown_value;
    INT_CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d wait for shutdown DONE! \n", client->my_node_id);
    return client->shutdown_value;
}